

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_misc.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_4::ValidateAssumeTrue(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  DiagnosticStream *this;
  DiagnosticStream local_200;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t operand_type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = ValidationState_t::GetOperandTypeId(_,inst,0);
  if ((local_24 != 0) &&
     (bVar1 = ValidationState_t::IsBoolScalarType((ValidationState_t *)inst_local,local_24), bVar1))
  {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag
            (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  this = DiagnosticStream::operator<<
                   (&local_200,
                    (char (*) [58])"Value operand of OpAssumeTrueKHR must be a boolean scalar");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateAssumeTrue(ValidationState_t& _, const Instruction* inst) {
  const auto operand_type_id = _.GetOperandTypeId(inst, 0);
  if (!operand_type_id || !_.IsBoolScalarType(operand_type_id)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Value operand of OpAssumeTrueKHR must be a boolean scalar";
  }
  return SPV_SUCCESS;
}